

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O3

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  _Base_ptr p_Var1;
  Expression **ppEVar2;
  bool bVar3;
  pointer pEVar4;
  Expression *this_01;
  bool bVar5;
  Expression ***pppEVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_type __n;
  ChildIterator *pCVar13;
  _Base_ptr p_Var14;
  EffectAnalyzer *effects;
  undefined1 other [8];
  Expression **ppEVar15;
  optional<wasm::Type> type_;
  undefined1 local_238 [8];
  EffectAnalyzer blockChildEffects;
  undefined1 local_c0 [8];
  ChildIterator iterator;
  undefined1 auStack_78 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Expression *child;
  Expression *local_50;
  Expression *back;
  uint local_3c;
  ulong local_38;
  
  if ((0x35 < (ulong)curr->_id) || ((0x3000000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    auStack_78 = (undefined1  [8])0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,curr);
    uVar9 = ((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3]) >> 3) + (long)local_c0;
    iVar7 = (int)uVar9;
    if (iVar7 != 0) {
      lVar11 = (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems[3] >> 3;
      if ((ulong)(lVar11 + (long)local_c0) <= (ulong)(iVar7 - 1)) {
LAB_00968d82:
        __assert_fail("index < children.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                      ,0x4a,
                      "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                     );
      }
      uVar10 = (long)local_c0 + lVar11;
      uVar8 = 0xffffffff;
      uVar12 = 0;
      do {
        uVar10 = uVar10 - 1;
        pCVar13 = (ChildIterator *)
                  (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   [3] + -4);
        if ((uVar10 & 0xfffffffc) == 0) {
          pCVar13 = &iterator;
        }
        __n = uVar12 & 0xffffffff;
        if ((*(pCVar13->super_AbstractChildIterator<wasm::ChildIterator>).children.fixed._M_elems
              [(uVar10 & 0xffffffff) - 1])->_id != BlockId) {
          __n = (size_type)uVar8;
        }
        uVar12 = uVar12 + 1;
        uVar8 = (uint)__n;
      } while ((uVar9 & 0xffffffff) != uVar12);
      if (uVar8 != 0xffffffff) {
        local_3c = uVar8;
        if (uVar8 != 0) {
          std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                    ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                     auStack_78,__n);
        }
        local_3c = local_3c + 1;
        uVar9 = 0;
        back = (Expression *)0x0;
        do {
          uVar10 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3] >> 3) + (long)local_c0;
          if (uVar10 <= uVar9) goto LAB_00968d82;
          local_38 = uVar9;
          blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               ~uVar9;
          uVar8 = (int)uVar10 +
                  (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
          pppEVar6 = (Expression ***)
                     (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3] + ((ulong)uVar8 - 4));
          if ((uVar8 & 0xfffffffc) == 0) {
            pppEVar6 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                       _M_elems + ((ulong)uVar8 - 1);
          }
          childEffects.
          super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)**pppEVar6;
          if ((((childEffects.
                 super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->ignoreImplicitTraps == true) &&
              (*(long *)&((childEffects.
                           super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->localsRead)._M_t.
                         _M_impl == 0)) &&
             (p_Var1 = ((childEffects.
                         super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->localsRead)._M_t.
                       _M_impl.super__Rb_tree_header._M_header._M_parent, (_Base_ptr)0x1 < p_Var1))
          {
            local_50 = *(Expression **)
                        (*(long *)&((childEffects.
                                     super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->localsRead
                                   )._M_t._M_impl.super__Rb_tree_header._M_header +
                        (long)((long)&p_Var1[-1]._M_right + 7) * 8);
            if (((Type *)&(childEffects.
                           super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->module)->id ==
                (local_50->type).id) {
              bVar3 = false;
              p_Var14 = (_Base_ptr)0x0;
              iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)childEffects.
                            super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              while( true ) {
                if ((_Base_ptr)
                    iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage[5] <= p_Var14)
                goto LAB_00968da1;
                if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage[4][(long)p_Var14] == local_50)
                break;
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)local_238,
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,
                           iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[4][(long)p_Var14]);
                pEVar4 = childEffects.
                         super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                for (other = auStack_78; other != (undefined1  [8])pEVar4;
                    other = (undefined1  [8])((long)other + 0x160)) {
                  bVar5 = EffectAnalyzer::invalidates
                                    ((EffectAnalyzer *)local_238,(EffectAnalyzer *)other);
                  if (bVar5) {
                    bVar3 = true;
                    break;
                  }
                }
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.danglingPop);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.mutableGlobalsRead._M_t._M_impl.
                                super__Rb_tree_header._M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.features);
                p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 1);
                if ((p_Var14 == p_Var1) || (bVar3)) break;
              }
              if (bVar3) {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           auStack_78,
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,
                           (Expression **)
                           &childEffects.
                            super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                ppEVar2 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[5];
                if (back == (Expression *)0x0) {
                  if (ppEVar2 == (Expression **)0x0) {
                    __assert_fail("usedElements > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                  ,0xd5,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::pop_back() [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage[5] =
                       (Expression **)((long)ppEVar2 - 1);
                  back = (Expression *)
                         iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                         .
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else if (ppEVar2 != (Expression **)0x0) {
                  this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (back + 2);
                  ppEVar15 = (Expression **)0x0;
                  do {
                    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[5] <= ppEVar15) {
LAB_00968da1:
                      __assert_fail("index < usedElements",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                    ,0xbc,
                                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                   );
                    }
                    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[4][(long)ppEVar15] ==
                        local_50) break;
                    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                              (this_00,iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                       children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4]
                                       [(long)ppEVar15]);
                    ppEVar15 = (Expression **)((long)ppEVar15 + 1);
                  } while (ppEVar2 != ppEVar15);
                }
                uVar9 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3] >> 3) + (long)local_c0;
                if (uVar9 <= local_38) goto LAB_00968d82;
                uVar8 = (int)uVar9 +
                        (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count;
                pppEVar6 = (Expression ***)
                           (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3] + ((ulong)uVar8 - 4));
                if ((uVar8 & 0xfffffffc) == 0) {
                  pppEVar6 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             fixed._M_elems + ((ulong)uVar8 - 1);
                }
                **pppEVar6 = local_50;
                if (local_38 < __n) {
                  std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                  emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                            ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                             auStack_78,
                             &((this->
                               super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                               ).super_Pass.runner)->options,
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).
                             super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                             .
                             super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                             .currModule,&local_50);
                }
              }
            }
            else {
              std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
              emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                        ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                         auStack_78,
                         &((this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).super_Pass.runner)->options,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).
                         super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .
                         super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .currModule,
                         (Expression **)
                         &childEffects.
                          super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          else {
            std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
            emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                      ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                       auStack_78,
                       &((this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                       ).
                       super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .
                       super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .currModule,
                       (Expression **)
                       &childEffects.
                        super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          this_01 = back;
          uVar9 = local_38 + 1;
        } while (local_3c != (int)uVar9);
        if (back != (Expression *)0x0) {
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (back + 2),curr);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)(curr->type).id;
          Block::finalize((Block *)this_01,type_,Unknown);
          Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                          ).
                          super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                          .
                          super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         ,this_01);
          this->refinalize = true;
        }
      }
    }
    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
        (Expression **)0x0) {
      operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3],
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3]);
    }
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
      refinalize = true;
    }
  }